

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O3

void __thiscall io::detail::AsynchronousReader::~AsynchronousReader(AsynchronousReader *this)

{
  _Head_base<0UL,_io::ByteSourceBase_*,_false> _Var1;
  pointer *__ptr;
  undefined1 local_20 [8];
  unique_lock<std::mutex> guard;
  
  if ((this->byte_source)._M_t.
      super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
      super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
      super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl != (ByteSourceBase *)0x0) {
    local_20 = (undefined1  [8])&this->lock;
    guard._M_device._0_1_ = 0;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
    guard._M_device._0_1_ = 1;
    this->termination_requested = true;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
    std::condition_variable::notify_one();
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->read_requested_condition);
  std::condition_variable::~condition_variable(&this->read_finished_condition);
  if ((this->read_error)._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if ((this->worker)._M_id._M_thread == 0) {
    _Var1._M_head_impl =
         (this->byte_source)._M_t.
         super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
         super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
         super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (ByteSourceBase *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_ByteSourceBase[2])();
    }
    (this->byte_source)._M_t.
    super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
    super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
    super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl = (ByteSourceBase *)0x0;
    return;
  }
  std::terminate();
}

Assistant:

~AsynchronousReader(){
                                if(byte_source != nullptr){
                                        {
                                                std::unique_lock<std::mutex>guard(lock);
                                                termination_requested = true;
                                        }
                                        read_requested_condition.notify_one();
                                        worker.join();
                                }
                        }